

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall md::Code::bhi(Code *this,string *label)

{
  undefined8 in_RAX;
  mapped_type *this_00;
  undefined8 uStack_18;
  
  uStack_18._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
  uStack_18._0_3_ = CONCAT12(0x62,(short)in_RAX);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
             (uchar *)((long)&uStack_18 + 2));
  uStack_18._0_4_ = (uint)(uint3)uStack_18;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
             (uchar *)((long)&uStack_18 + 3));
  uStack_18 = CONCAT44(*(int *)&(this->_bytes).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                       *(int *)&(this->_bytes).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(uint)uStack_18);
  this_00 = std::
            map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_pending_branches,(key_type_conflict3 *)((long)&uStack_18 + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,label);
  resolve_branches(this);
  return this;
}

Assistant:

Code& Code::bhi(const std::string& label)
{
    this->add_opcode(0x6200);
    _pending_branches[static_cast<uint32_t>(_bytes.size())] = label;
    this->resolve_branches();
    return *this;
}